

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parquet_writer.cpp
# Opt level: O2

uint32_t __thiscall
duckdb::ParquetWriter::WriteData(ParquetWriter *this,const_data_ptr_t buffer,uint32_t buffer_size)

{
  TProtocol *oprot;
  uint32_t uVar1;
  ParquetEncryptionConfig *this_00;
  string *key;
  type encryption_util_p;
  __shared_ptr<duckdb_apache::thrift::transport::TTransport,_(__gnu_cxx::_Lock_policy)2> local_38;
  
  if ((this->encryption_config).internal.
      super___shared_ptr<duckdb::ParquetEncryptionConfig,_(__gnu_cxx::_Lock_policy)2>._M_ptr !=
      (element_type *)0x0) {
    oprot = (this->protocol).
            super___shared_ptr<duckdb_apache::thrift::protocol::TProtocol,_(__gnu_cxx::_Lock_policy)2>
            ._M_ptr;
    this_00 = shared_ptr<duckdb::ParquetEncryptionConfig,_true>::operator->
                        (&this->encryption_config);
    key = ParquetEncryptionConfig::GetFooterKey_abi_cxx11_(this_00);
    encryption_util_p = shared_ptr<duckdb::EncryptionUtil,_true>::operator*(&this->encryption_util);
    uVar1 = ParquetCrypto::WriteData(oprot,buffer,buffer_size,key,encryption_util_p);
    return uVar1;
  }
  ::std::__shared_ptr<duckdb_apache::thrift::transport::TTransport,_(__gnu_cxx::_Lock_policy)2>::
  __shared_ptr(&local_38,
               &(((this->protocol).
                  super___shared_ptr<duckdb_apache::thrift::protocol::TProtocol,_(__gnu_cxx::_Lock_policy)2>
                 ._M_ptr)->ptrans_).
                super___shared_ptr<duckdb_apache::thrift::transport::TTransport,_(__gnu_cxx::_Lock_policy)2>
              );
  (*(local_38._M_ptr)->_vptr_TTransport[9])(local_38._M_ptr,buffer,(ulong)buffer_size);
  ::std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_38._M_refcount);
  return buffer_size;
}

Assistant:

uint32_t ParquetWriter::WriteData(const const_data_ptr_t buffer, const uint32_t buffer_size) {
	if (encryption_config) {
		return ParquetCrypto::WriteData(*protocol, buffer, buffer_size, encryption_config->GetFooterKey(),
		                                *encryption_util);
	} else {
		protocol->getTransport()->write(buffer, buffer_size);
		return buffer_size;
	}
}